

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endpoint.cpp
# Opt level: O0

string * __thiscall booster::aio::endpoint::ip_abi_cxx11_(endpoint *this)

{
  family_type fVar1;
  data *pdVar2;
  char *pcVar3;
  copy_ptr<booster::aio::endpoint::data> *in_RSI;
  string *in_RDI;
  char *res_1;
  char buf_1 [47];
  char *res;
  char buf [17];
  endpoint *in_stack_ffffffffffffff48;
  allocator *paVar4;
  endpoint *in_stack_ffffffffffffff50;
  allocator local_81;
  char *local_80;
  char local_78 [71];
  allocator local_31;
  char *local_30;
  char local_28 [40];
  
  fVar1 = family(in_stack_ffffffffffffff48);
  if (fVar1 == pf_inet) {
    memset(local_28,0,0x11);
    pdVar2 = copy_ptr<booster::aio::endpoint::data>::operator->(in_RSI);
    pcVar3 = inet_ntop(2,(void *)((long)&pdVar2->sa + 4),local_28,0x11);
    local_30 = pcVar3;
    if (pcVar3 != (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,pcVar3,&local_31);
      std::allocator<char>::~allocator((allocator<char> *)&local_31);
      return in_RDI;
    }
    throw_invalid(in_stack_ffffffffffffff50);
  }
  else if (fVar1 == pf_inet6) {
    memset(local_78,0,0x2f);
    pdVar2 = copy_ptr<booster::aio::endpoint::data>::operator->(in_RSI);
    pcVar3 = inet_ntop(10,(void *)((long)&pdVar2->sa + 8),local_78,0x2f);
    local_80 = pcVar3;
    if (pcVar3 != (char *)0x0) {
      paVar4 = &local_81;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,pcVar3,paVar4);
      std::allocator<char>::~allocator((allocator<char> *)&local_81);
      return in_RDI;
    }
    throw_invalid(in_stack_ffffffffffffff50);
  }
  else {
    throw_invalid(in_stack_ffffffffffffff50);
  }
  std::__cxx11::string::string((string *)in_RDI);
  return in_RDI;
}

Assistant:

std::string endpoint::ip() const
{
	switch(family()) {
	case pf_inet:
		{
#ifndef BOOSTER_WIN32
			char buf[INET_ADDRSTRLEN+1] = {0};
			char const *res = ::inet_ntop(AF_INET,&d->sa.in.sin_addr,buf,sizeof(buf));
			if(res)
				return std::string(res);
			throw_invalid();
#else
			std::ostringstream tmp;
			tmp.imbue(std::locale::classic());
			unsigned char const *p = reinterpret_cast<unsigned char const *>(&d->sa.in.sin_addr);
			tmp << int(p[0]) <<"." << int(p[1]) <<"."<<int(p[2]) <<"." << int(p[3]);
			return tmp.str();
#endif
		}
		break;
#ifndef BOOSTER_AIO_NO_PF_INET6
	case pf_inet6:
		{
			char buf[INET6_ADDRSTRLEN+1] = {0};
            #ifndef BOOSTER_WIN32
			char const *res = ::inet_ntop(AF_INET6,&d->sa.in6.sin6_addr,buf,sizeof(buf));
            #else
            struct in6_addr addr = d->sa.in6.sin6_addr; 
            // under windows it isn't const function
            char const *res = ::inet_ntop(AF_INET6,&addr,buf,sizeof(buf));
            #endif
			if(res)
				return std::string(res);
			throw_invalid();
		}
		break;
#endif
	default:
		throw_invalid();
	}
	return std::string(); // shut gcc up
}